

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::transform(btSoftBody *this,btTransform *trs)

{
  uint uVar1;
  Node *pNVar2;
  undefined8 uVar3;
  ulong uVar4;
  btVector3 *x;
  btVector3 *pbVar5;
  ulong uVar6;
  btScalar r;
  btVector3 bVar7;
  btDbvtVolume vol;
  btDbvtVolume local_78;
  btDbvtAabbMm local_50;
  
  (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
  uVar1 = (this->m_nodes).m_size;
  uVar6 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar6;
  }
  for (; uVar4 * 0x78 - uVar6 != 0; uVar6 = uVar6 + 0x78) {
    pNVar2 = (this->m_nodes).m_data;
    x = (btVector3 *)((long)(pNVar2->m_x).m_floats + uVar6);
    bVar7 = btTransform::operator()(trs,x);
    *&x->m_floats = bVar7.m_floats;
    pbVar5 = (btVector3 *)((long)(pNVar2->m_q).m_floats + uVar6);
    bVar7 = btTransform::operator()(trs,pbVar5);
    *&pbVar5->m_floats = bVar7.m_floats;
    pbVar5 = (btVector3 *)((long)(pNVar2->m_n).m_floats + uVar6);
    bVar7 = operator*(&trs->m_basis,pbVar5);
    *&pbVar5->m_floats = bVar7.m_floats;
    btDbvtAabbMm::FromCR(&local_50,x,r);
    local_78.mx.m_floats[0] = local_50.mx.m_floats[0];
    local_78.mx.m_floats[1] = local_50.mx.m_floats[1];
    local_78.mx.m_floats[2] = local_50.mx.m_floats[2];
    local_78.mx.m_floats[3] = local_50.mx.m_floats[3];
    local_78.mi.m_floats[0] = local_50.mi.m_floats[0];
    local_78.mi.m_floats[1] = local_50.mi.m_floats[1];
    local_78.mi.m_floats[2] = local_50.mi.m_floats[2];
    local_78.mi.m_floats[3] = local_50.mi.m_floats[3];
    btDbvt::update(&this->m_ndbvt,*(btDbvtNode **)((long)(&pNVar2->m_n + 1) + uVar6 + 8),&local_78);
  }
  updateNormals(this);
  updateBounds(this);
  updateConstants(this);
  uVar3 = *(undefined8 *)((trs->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_initialWorldTransform).m_basis.m_el[0].m_floats =
       *(undefined8 *)(trs->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_initialWorldTransform).m_basis.m_el[0].m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)((trs->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_initialWorldTransform).m_basis.m_el[1].m_floats =
       *(undefined8 *)(trs->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_initialWorldTransform).m_basis.m_el[1].m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)((trs->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_initialWorldTransform).m_basis.m_el[2].m_floats =
       *(undefined8 *)(trs->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_initialWorldTransform).m_basis.m_el[2].m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)((trs->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_initialWorldTransform).m_origin.m_floats =
       *(undefined8 *)(trs->m_origin).m_floats;
  *(undefined8 *)((this->m_initialWorldTransform).m_origin.m_floats + 2) = uVar3;
  return;
}

Assistant:

void			btSoftBody::transform(const btTransform& trs)
{
	const btScalar	margin=getCollisionShape()->getMargin();
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	vol;
	
	for(int i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		n.m_x=trs*n.m_x;
		n.m_q=trs*n.m_q;
		n.m_n=trs.getBasis()*n.m_n;
		vol = btDbvtVolume::FromCR(n.m_x,margin);
		
		m_ndbvt.update(n.m_leaf,vol);
	}
	updateNormals();
	updateBounds();
	updateConstants();
	m_initialWorldTransform = trs;
}